

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gitlike.cxx
# Opt level: O3

void Init(string *progname,const_iterator beginargs,const_iterator endargs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  void *pvVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  begin;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  ostream *poVar6;
  long lVar7;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  ParseError e;
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  directory;
  Flag quiet;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  templatedir;
  Flag bare;
  HelpFlag help;
  ArgumentParser parser;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  undefined1 local_ae0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ac8;
  undefined2 local_ab8;
  undefined1 *local_ab0 [2];
  undefined1 local_aa0 [16];
  string local_a90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a68;
  undefined1 local_a60 [8];
  _Alloc_hider local_a58;
  char local_a50 [8];
  char local_a48 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a28;
  _Alloc_hider local_9c0;
  size_type local_9b8;
  undefined1 local_978 [8];
  _Alloc_hider local_970;
  char local_968 [8];
  char local_960 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_940 [3];
  undefined1 local_868 [272];
  _Alloc_hider local_758;
  size_type local_750;
  undefined1 local_710 [16];
  __node_base local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8;
  undefined2 local_6e8;
  _Alloc_hider local_6e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_6d8 [3];
  undefined1 local_600 [272];
  undefined1 local_4f0 [1216];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"In Init",7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  pcVar2 = local_868 + 0x10;
  local_868._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_868,"");
  local_600._8_8_ = 0;
  local_600[0x10] = '\0';
  local_600._0_8_ = local_600 + 0x10;
  args::ArgumentParser::ArgumentParser
            ((ArgumentParser *)local_4f0,(string *)local_868,(string *)local_600);
  if ((undefined1 *)local_600._0_8_ != local_600 + 0x10) {
    operator_delete((void *)local_600._0_8_);
  }
  if ((pointer)local_868._0_8_ != pcVar2) {
    operator_delete((void *)local_868._0_8_);
  }
  pcVar4 = (progname->_M_dataplus)._M_p;
  local_868._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_868,pcVar4,pcVar4 + progname->_M_string_length);
  std::__cxx11::string::append(local_868);
  std::__cxx11::string::_M_assign((string *)(local_4f0 + 0x2b8));
  if ((pointer)local_868._0_8_ != pcVar2) {
    operator_delete((void *)local_868._0_8_);
  }
  local_a70._M_current = beginargs._M_current;
  local_978 = (undefined1  [8])local_968;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_978,"help","");
  local_a60 = (undefined1  [8])local_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"Display this help menu","");
  local_710._8_8_ = &local_6f8;
  local_710[0] = true;
  local_710[1] = 'h';
  local_700._M_nxt = (_Hash_node_base *)0x0;
  local_6f8._M_local_buf[0] = '\0';
  local_6e8 = 0;
  local_6e0._M_p = (pointer)&local_6d8[0]._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_710;
  args::Matcher::Matcher((Matcher *)local_868,in);
  local_a68._M_current = endargs._M_current;
  args::Flag::Flag((Flag *)local_600,(Group *)local_4f0,(string *)local_978,(string *)local_a60,
                   (Matcher *)local_868,None);
  local_600._0_8_ = &PTR__FlagBase_001225d0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_868 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_868);
  lVar7 = 0;
  do {
    pvVar5 = *(void **)((long)local_6d8 + lVar7 + -8);
    if ((void *)((long)&local_6d8[0]._M_bucket_count + lVar7) != pvVar5) {
      operator_delete(pvVar5);
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x50);
  if (local_a60 != (undefined1  [8])local_a50) {
    operator_delete((void *)local_a60);
  }
  if (local_978 != (undefined1  [8])local_968) {
    operator_delete((void *)local_978);
  }
  local_a60 = (undefined1  [8])local_a50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a60,"template-directory","");
  pcVar2 = local_ae0 + 0x10;
  local_ae0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_ae0,"directory from which templates will be used","");
  local_978 = (undefined1  [8])((ulong)local_978 & 0xffffffffffff0000);
  local_970._M_p = local_960;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"template","");
  in_00._M_len = 1;
  in_00._M_array = (iterator)local_978;
  args::Matcher::Matcher((Matcher *)local_710,in_00);
  paVar1 = &local_b00.field_2;
  local_b00._M_string_length = 0;
  local_b00.field_2._M_local_buf[0] = '\0';
  local_b00._M_dataplus._M_p = (pointer)paVar1;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
               *)local_868,(Group *)local_4f0,(string *)local_a60,(string *)local_ae0,
              (Matcher *)local_710,&local_b00,None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != paVar1) {
    operator_delete(local_b00._M_dataplus._M_p);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_6d8);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_710);
  if (local_970._M_p != local_960) {
    operator_delete(local_970._M_p);
  }
  if ((pointer)local_ae0._0_8_ != pcVar2) {
    operator_delete((void *)local_ae0._0_8_);
  }
  if (local_a60 != (undefined1  [8])local_a50) {
    operator_delete((void *)local_a60);
  }
  local_ae0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"bare","");
  local_b00._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b00,"create a bare repository","");
  local_a60 = (undefined1  [8])((ulong)local_a60 & 0xffffffffffff0000);
  local_a58._M_p = local_a48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a58,"bare","");
  in_01._M_len = 1;
  in_01._M_array = (iterator)local_a60;
  args::Matcher::Matcher((Matcher *)local_978,in_01);
  args::Flag::Flag((Flag *)local_710,(Group *)local_4f0,(string *)local_ae0,&local_b00,
                   (Matcher *)local_978,None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(local_940);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_978);
  if (local_a58._M_p != local_a48) {
    operator_delete(local_a58._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != paVar1) {
    operator_delete(local_b00._M_dataplus._M_p);
  }
  if ((pointer)local_ae0._0_8_ != pcVar2) {
    operator_delete((void *)local_ae0._0_8_);
  }
  local_b00._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b00,"quiet","");
  paVar3 = &local_a90.field_2;
  local_a90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"be quiet","");
  local_ae0._8_8_ = &local_ac8;
  local_ae0._0_2_ = 0x7101;
  local_ae0._16_8_ = 0;
  local_ac8._M_local_buf[0] = '\0';
  local_ab8 = 0;
  local_ab0[0] = local_aa0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ab0,"quiet","");
  in_02._M_len = 2;
  in_02._M_array = (iterator)local_ae0;
  args::Matcher::Matcher((Matcher *)local_a60,in_02);
  args::Flag::Flag((Flag *)local_978,(Group *)local_4f0,&local_b00,&local_a90,(Matcher *)local_a60,
                   None);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_a28);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_a60);
  lVar7 = 0;
  do {
    if (local_aa0 + lVar7 != *(undefined1 **)((long)local_ab0 + lVar7)) {
      operator_delete(*(undefined1 **)((long)local_ab0 + lVar7));
    }
    lVar7 = lVar7 + -0x28;
  } while (lVar7 != -0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != paVar3) {
    operator_delete(local_a90._M_dataplus._M_p);
  }
  end._M_current = local_a68._M_current;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != paVar1) {
    operator_delete(local_b00._M_dataplus._M_p);
  }
  local_ae0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae0,"directory","");
  local_b00._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b00,"The directory to create in","");
  local_a90._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,".","");
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_a60,(Group *)local_4f0,(string *)local_ae0,&local_b00,&local_a90,None);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != paVar3) {
    operator_delete(local_a90._M_dataplus._M_p);
  }
  begin._M_current = local_a70._M_current;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b00._M_dataplus._M_p != paVar1) {
    operator_delete(local_b00._M_dataplus._M_p);
  }
  if ((pointer)local_ae0._0_8_ != pcVar2) {
    operator_delete((void *)local_ae0._0_8_);
  }
  (**(_func_int **)(local_4f0._0_8_ + 0x70))((ArgumentParser *)local_4f0);
  args::ArgumentParser::
  Parse<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((ArgumentParser *)local_4f0,begin,end);
  *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) | 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"templatedir: ",0xd);
  (**(code **)(local_868._0_8_ + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", value: ",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_758._M_p,local_750);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bare: ",6);
  (**(code **)(CONCAT62(local_710._2_6_,local_710._0_2_) + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quiet: ",7);
  (**(code **)((long)local_978 + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"directory: ",0xb);
  (**(code **)((long)local_a60 + 0x10))();
  poVar6 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", value: ",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_9c0._M_p,local_9b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  args::
  Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~Positional((Positional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                 *)local_a60);
  args::FlagBase::~FlagBase((FlagBase *)local_978);
  args::FlagBase::~FlagBase((FlagBase *)local_710);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader>
                *)local_868);
  args::FlagBase::~FlagBase((FlagBase *)local_600);
  local_4f0._0_8_ = &PTR__ArgumentParser_001221c8;
  args::HelpParams::~HelpParams((HelpParams *)(local_4f0 + 0x210));
  if ((undefined1 *)local_4f0._472_8_ != local_4f0 + 0x1e8) {
    operator_delete((void *)local_4f0._472_8_);
  }
  if ((undefined1 *)local_4f0._440_8_ != local_4f0 + 0x1c8) {
    operator_delete((void *)local_4f0._440_8_);
  }
  if ((undefined1 *)local_4f0._408_8_ != local_4f0 + 0x1a8) {
    operator_delete((void *)local_4f0._408_8_);
  }
  if ((undefined1 *)local_4f0._376_8_ != local_4f0 + 0x188) {
    operator_delete((void *)local_4f0._376_8_);
  }
  args::Command::~Command((Command *)local_4f0);
  return;
}

Assistant:

void Init(const std::string &progname, std::vector<std::string>::const_iterator beginargs, std::vector<std::string>::const_iterator endargs)
{
    std::cout << "In Init" << std::endl;
    args::ArgumentParser parser("");
    parser.Prog(progname + " init");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::ValueFlag<std::string> templatedir(parser, "template-directory", "directory from which templates will be used", {"template"});
    args::Flag bare(parser, "bare", "create a bare repository", {"bare"});
    args::Flag quiet(parser, "quiet", "be quiet", {'q', "quiet"});
    args::Positional<std::string> directory(parser, "directory", "The directory to create in", ".");
    try
    {
        parser.ParseArgs(beginargs, endargs);
        std::cout << std::boolalpha;
        std::cout << "templatedir: " << bool{templatedir} << ", value: " << args::get(templatedir) << std::endl;
        std::cout << "bare: " << bool{bare} << std::endl;
        std::cout << "quiet: " << bool{quiet} << std::endl;
        std::cout << "directory: " << bool{directory} << ", value: " << args::get(directory) << std::endl;
    }
    catch (args::Help)
    {
        std::cout << parser;
        return;
    }
    catch (args::ParseError e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return;
    }
}